

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
::find_position<HashObject<4,4>*>
          (dense_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
           *this,HashObject<4,_4> **key)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  HashObject<4,_4> *pHVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  uVar2 = (ulong)*key >> 3 & *(long *)(this + 0x40) - 1U;
  pHVar5 = *(HashObject<4,_4> **)(*(long *)(this + 0x50) + uVar2 * 0x10);
  uVar1 = 0xffffffffffffffff;
  if (*(HashObject<4,_4> **)(this + 0x28) == pHVar5) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    lVar3 = 1;
    do {
      if ((*(long *)(this + 0x30) == 0) || (*(HashObject<4,_4> **)(this + 0x20) != pHVar5)) {
        if (*key == pHVar5) {
          uVar1 = uVar2;
          uVar2 = 0xffffffffffffffff;
          goto LAB_0012bc79;
        }
      }
      else if (uVar4 == 0xffffffffffffffff) {
        uVar4 = uVar2;
      }
      uVar2 = uVar2 + lVar3 & *(long *)(this + 0x40) - 1U;
      pHVar5 = *(HashObject<4,_4> **)(*(long *)(this + 0x50) + uVar2 * 0x10);
      lVar3 = lVar3 + 1;
    } while (*(HashObject<4,_4> **)(this + 0x28) != pHVar5);
  }
  if (uVar4 != 0xffffffffffffffff) {
    uVar2 = uVar4;
  }
LAB_0012bc79:
  pVar6.second = uVar2;
  pVar6.first = uVar1;
  return pVar6;
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    while (1) {                             // probe until something happens
      if (test_empty(bucknum)) {            // bucket is empty
        if (insert_pos == ILLEGAL_BUCKET)   // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);

      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;

      } else if (equals(key, get_key(table[bucknum]))) {
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }